

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmLinkLineComputer *__p;
  pointer linkLineComputer_00;
  cmOutputConverter *local_160;
  cmStateSnapshot local_128;
  cmStateDirectory local_110;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> local_e8;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  string local_d8;
  undefined1 local_b8 [8];
  string extraFlags;
  undefined1 local_90 [8];
  string linkRuleVar;
  string linkLanguage;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string linkRuleVar_1;
  bool requiresDeviceLinking;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  linkRuleVar_1.field_2._M_local_buf[0xf] = relink;
  if ((!relink) &&
     (linkRuleVar_1.field_2._M_local_buf[0xe] =
           requireDeviceLinking
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget,
                      (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                      &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       ConfigName), (bool)linkRuleVar_1.field_2._M_local_buf[0xe])) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",&local_39);
    std::allocator<char>::~allocator(&local_39);
    WriteDeviceLibraryRules
              (this,(string *)local_38,(bool)(linkRuleVar_1.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)local_38);
  }
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)((long)&linkRuleVar.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"CMAKE_",(allocator<char> *)(extraFlags.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(extraFlags.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=
            ((string *)local_90,(string *)(linkRuleVar.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_90,"_CREATE_SHARED_MODULE");
  std::__cxx11::string::string((string *)local_b8);
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_b8,
             (string *)((long)&linkRuleVar.field_2 + 8));
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"CMAKE_MODULE_LINKER_FLAGS",
             (allocator<char> *)
             ((long)&linkLineComputer._M_t.
                     super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                     .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 7));
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar1,(string *)local_b8,&local_d8,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&linkLineComputer._M_t.
                     super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                     .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 7));
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_160 = (cmOutputConverter *)0x0;
  if (pcVar1 != (cmLocalUnixMakefileGenerator3 *)0x0) {
    local_160 = &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
  }
  cmLocalGenerator::GetStateSnapshot
            (&local_128,(cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmStateSnapshot::GetDirectory(&local_110,&local_128);
  __p = cmMakefileTargetGenerator::CreateLinkLineComputer
                  (&this->super_cmMakefileTargetGenerator,local_160,&local_110);
  std::unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>>::
  unique_ptr<std::default_delete<cmLinkLineComputer>,void>
            ((unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>> *)&local_e8,__p
            );
  linkLineComputer_00 =
       std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get(&local_e8)
  ;
  cmCommonTargetGenerator::AddModuleDefinitionFlag
            ((cmCommonTargetGenerator *)this,linkLineComputer_00,(string *)local_b8);
  WriteLibraryRules(this,(string *)local_90,(string *)local_b8,
                    (bool)(linkRuleVar_1.field_2._M_local_buf[0xf] & 1));
  std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::~unique_ptr
            (&local_e8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{
  if (!relink) {
    const bool requiresDeviceLinking = requireDeviceLinking(
      *this->GeneratorTarget, *this->LocalGenerator, this->ConfigName);
    if (requiresDeviceLinking) {
      std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
      this->WriteDeviceLibraryRules(linkRuleVar, relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_MODULE";

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->ConfigName);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory()));

  this->AddModuleDefinitionFlag(linkLineComputer.get(), extraFlags);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}